

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O2

void __thiscall printable_sbo_cow::printable_sbo_cow(printable_sbo_cow *this,printable_sbo_cow *rhs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ptrdiff_t pVar4;
  printable_sbo_cow *h;
  
  h = (printable_sbo_cow *)rhs->handle_;
  if (h == (printable_sbo_cow *)0x0) {
    h = (printable_sbo_cow *)0x0;
  }
  else if (h < rhs + 1 && &rhs->buffer_ <= h) {
    pVar4 = handle_offset((handle_base *)h,&rhs->buffer_);
    h = (printable_sbo_cow *)((this->buffer_)._M_elems + pVar4);
  }
  this->handle_ = (handle_base *)h;
  uVar1 = *(undefined4 *)((rhs->buffer_)._M_elems + 4);
  uVar2 = *(undefined4 *)((rhs->buffer_)._M_elems + 8);
  uVar3 = *(undefined4 *)((rhs->buffer_)._M_elems + 0xc);
  *(undefined4 *)(this->buffer_)._M_elems = *(undefined4 *)(rhs->buffer_)._M_elems;
  *(undefined4 *)((this->buffer_)._M_elems + 4) = uVar1;
  *(undefined4 *)((this->buffer_)._M_elems + 8) = uVar2;
  *(undefined4 *)((this->buffer_)._M_elems + 0xc) = uVar3;
  *(undefined8 *)((this->buffer_)._M_elems + 0x10) = *(undefined8 *)((rhs->buffer_)._M_elems + 0x10)
  ;
  if (h != (printable_sbo_cow *)0x0) {
    (*(code *)h->handle_[4]._vptr_handle_base)();
    return;
  }
  return;
}

Assistant:

printable_sbo_cow (const printable_sbo_cow & rhs) :
        handle_ (
            !rhs.handle_ || heap_allocated(rhs.handle_, rhs.buffer_) ?
            rhs.handle_ :
            handle_ptr(
                char_ptr(&buffer_) + handle_offset(rhs.handle_, rhs.buffer_)
            )
        ),
        buffer_ (rhs.buffer_)
    {
        if (handle_)
            handle_->add_ref();
    }